

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O2

__pid_t __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
::wait(proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_so_5::disp::adv_thread_pool::disp_params_t>
       *this,void *__stat_loc)

{
  ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *peVar1;
  int iVar2;
  
  iVar2 = (*(((this->m_disp)._M_t.
              super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
              .
              super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_false>
             ._M_head_impl)->super_dispatcher_t)._vptr_dispatcher_t[4])();
  peVar1 = (this->m_disp)._M_t.
           super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
           .
           super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_false>
           ._M_head_impl;
  (this->m_disp)._M_t.
  super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
  .
  super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_false>
  ._M_head_impl = (ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *)0x0;
  if (peVar1 != (ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *)0x0) {
    iVar2 = (*(peVar1->super_dispatcher_t)._vptr_dispatcher_t[1])();
    return iVar2;
  }
  return iVar2;
}

Assistant:

virtual void
		wait() override
			{
				m_disp->wait();

				m_disp.reset();
			}